

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

int lddmc_iscopy(MDD mdd)

{
  uint8_t uVar1;
  mddnode_t n_00;
  mddnode_t n;
  MDD mdd_local;
  
  if (mdd < 2) {
    mdd_local._4_4_ = 0;
  }
  else {
    n_00 = LDD_GETNODE(mdd);
    uVar1 = mddnode_getcopy(n_00);
    mdd_local._4_4_ = (uint)(uVar1 != '\0');
  }
  return mdd_local._4_4_;
}

Assistant:

int
lddmc_iscopy(MDD mdd)
{
    if (mdd <= lddmc_true) return 0;

    mddnode_t n = LDD_GETNODE(mdd);
    return mddnode_getcopy(n) ? 1 : 0;
}